

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_socket_buffer.hpp
# Opt level: O0

void libtorrent::aux::set_socket_buffer_size<libtorrent::aux::udp_socket>
               (udp_socket *s,session_settings *sett,error_code *ec)

{
  bool bVar1;
  int iVar2;
  integer<1,_8> local_54;
  integer<1,_8> local_50;
  receive_buffer_size option_1;
  receive_buffer_size prev_option_1;
  int recv_size;
  send_buffer_size option;
  send_buffer_size prev_option;
  int snd_size;
  error_code ignore;
  int not_sent_low_watermark;
  error_code *ec_local;
  session_settings *sett_local;
  udp_socket *s_local;
  
  ignore.cat_._4_4_ = session_settings::get_int(sett,0x4085);
  if (ignore.cat_._4_4_ != 0) {
    boost::system::error_code::error_code((error_code *)&snd_size);
    tcp_notsent_lowat::tcp_notsent_lowat((tcp_notsent_lowat *)&prev_option,ignore.cat_._4_4_);
    udp_socket::set_option(s,(tcp_notsent_lowat *)&prev_option,(error_code *)&snd_size);
  }
  option.value_ = session_settings::get_int(sett,0x403c);
  if (option.value_ != 0) {
    boost::asio::detail::socket_option::integer<1,_7>::integer((integer<1,_7> *)&recv_size);
    udp_socket::get_option<boost::asio::detail::socket_option::integer<1,7>>
              (s,(integer<1,_7> *)&recv_size,ec);
    bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
    if ((!bVar1) &&
       (iVar2 = boost::asio::detail::socket_option::integer<1,_7>::value
                          ((integer<1,_7> *)&recv_size), iVar2 != option.value_)) {
      boost::asio::detail::socket_option::integer<1,_7>::integer
                ((integer<1,_7> *)&prev_option_1,option.value_);
      udp_socket::set_option<boost::asio::detail::socket_option::integer<1,7>>
                (s,(integer<1,_7> *)&prev_option_1,ec);
      bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
      if (bVar1) {
        udp_socket::set_option<boost::asio::detail::socket_option::integer<1,7>>
                  (s,(integer<1,_7> *)&recv_size,ec);
        return;
      }
    }
  }
  option_1.value_ = session_settings::get_int(sett,0x403b);
  if (option_1.value_ != 0) {
    boost::asio::detail::socket_option::integer<1,_8>::integer(&local_50);
    udp_socket::get_option<boost::asio::detail::socket_option::integer<1,8>>(s,&local_50,ec);
    bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
    if ((!bVar1) &&
       (iVar2 = boost::asio::detail::socket_option::integer<1,_8>::value(&local_50),
       iVar2 != option_1.value_)) {
      boost::asio::detail::socket_option::integer<1,_8>::integer(&local_54,option_1.value_);
      udp_socket::set_option<boost::asio::detail::socket_option::integer<1,8>>(s,&local_54,ec);
      bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
      if (bVar1) {
        udp_socket::set_option<boost::asio::detail::socket_option::integer<1,8>>(s,&local_50,ec);
      }
    }
  }
  return;
}

Assistant:

void set_socket_buffer_size(Socket& s, session_settings const& sett, error_code& ec)
	{
#ifdef TCP_NOTSENT_LOWAT
		int const not_sent_low_watermark = sett.get_int(settings_pack::send_not_sent_low_watermark);
		if (not_sent_low_watermark)
		{
			error_code ignore;
			s.set_option(tcp_notsent_lowat(not_sent_low_watermark), ignore);
		}
#endif
		int const snd_size = sett.get_int(settings_pack::send_socket_buffer_size);
		if (snd_size)
		{
			typename Socket::send_buffer_size prev_option;
			s.get_option(prev_option, ec);
			if (!ec && prev_option.value() != snd_size)
			{
				typename Socket::send_buffer_size option(snd_size);
				s.set_option(option, ec);
				if (ec)
				{
					// restore previous value
					s.set_option(prev_option, ec);
					return;
				}
			}
		}
		int const recv_size = sett.get_int(settings_pack::recv_socket_buffer_size);
		if (recv_size)
		{
			typename Socket::receive_buffer_size prev_option;
			s.get_option(prev_option, ec);
			if (!ec && prev_option.value() != recv_size)
			{
				typename Socket::receive_buffer_size option(recv_size);
				s.set_option(option, ec);
				if (ec)
				{
					// restore previous value
					s.set_option(prev_option, ec);
					return;
				}
			}
		}
	}